

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O3

optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>
::find(optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *__return_storage_ptr__,
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>
      *this,Key<128UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
            *equal)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_01;
  ulong uVar4;
  ulong uVar5;
  KeyValue<supermap::Key<128UL>,_unsigned_long> firstLeqElem;
  KeyValue<supermap::Key<128UL>,_unsigned_long> local_b8;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
            ).
            super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
            .
            super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
            ._vptr_OrderedStorage[1])(this);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              ._vptr_OrderedStorage[1])(this);
    uVar3 = CONCAT44(extraout_var_00,iVar2);
    if (uVar3 < 2) {
      uVar4 = 0;
    }
    else {
      uVar5 = 0;
      do {
        uVar4 = uVar5 + uVar3 >> 1;
        (*(this->
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
          ).
          super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
          .
          super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
          ._vptr_OrderedStorage[4])(&local_b8,this,uVar4);
        if ((less->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00198a35;
        bVar1 = (*less->_M_invoker)((_Any_data *)less,&local_b8,pattern);
        if (!bVar1) {
          if ((equal->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00198a35;
          bVar1 = (*equal->_M_invoker)((_Any_data *)equal,&local_b8,pattern);
          if (!bVar1) {
            uVar3 = uVar4;
            uVar4 = uVar5;
          }
        }
        uVar5 = uVar4;
      } while (1 < uVar3 - uVar4);
    }
    iVar2 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              ._vptr_OrderedStorage[1])(this);
    if (uVar4 < CONCAT44(extraout_var_01,iVar2)) {
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
        ._vptr_OrderedStorage[4])(&local_b8,this,uVar4);
      if ((equal->super__Function_base)._M_manager != (_Manager_type)0x0) {
        bVar1 = (*equal->_M_invoker)((_Any_data *)equal,&local_b8,pattern);
        if (bVar1) {
          memcpy(__return_storage_ptr__,&local_b8,0x88);
        }
        (__return_storage_ptr__->
        super__Optional_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>.
        _M_engaged = bVar1;
        return __return_storage_ptr__;
      }
LAB_00198a35:
      std::__throw_bad_function_call();
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_true,_true>).
  _M_payload.super__Optional_payload_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>.
  _M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }